

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O3

void __thiscall
flow::lang::ScopedSym::ScopedSym
          (ScopedSym *this,Type t,SymbolTable *outer,string *name,SourceLocation *loc)

{
  pointer pcVar1;
  SymbolTable *this_00;
  string local_48;
  
  Symbol::Symbol(&this->super_Symbol,t,name,loc);
  (this->super_Symbol).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ScopedSym_001ae828;
  this_00 = (SymbolTable *)operator_new(0x40);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  SymbolTable::SymbolTable(this_00,outer,&local_48);
  (this->scope_)._M_t.
  super___uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>._M_t
  .super__Tuple_impl<0UL,_flow::lang::SymbolTable_*,_std::default_delete<flow::lang::SymbolTable>_>.
  super__Head_base<0UL,_flow::lang::SymbolTable_*,_false>._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ScopedSym(Type t, SymbolTable* outer, const std::string& name,
            const SourceLocation& loc)
      : Symbol(t, name, loc), scope_(std::make_unique<SymbolTable>(outer, name)) {}